

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

CURLcode Curl_md5it(uchar *outbuffer,uchar *input,size_t len)

{
  CURLcode CVar1;
  uint uVar2;
  my_md5_ctx ctx;
  my_md5_ctx local_7c;
  
  CVar1 = my_md5_init(&local_7c);
  if (CVar1 == CURLE_OK) {
    uVar2 = curlx_uztoui(len);
    MD5_Update((MD5_CTX *)&local_7c,input,(ulong)uVar2);
    MD5_Final(outbuffer,(MD5_CTX *)&local_7c);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_md5it(unsigned char *outbuffer, const unsigned char *input,
                    const size_t len)
{
  CURLcode result;
  my_md5_ctx ctx;

  result = my_md5_init(&ctx);
  if(!result) {
    my_md5_update(&ctx, input, curlx_uztoui(len));
    my_md5_final(outbuffer, &ctx);
  }
  return result;
}